

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.h
# Opt level: O1

string * prometheus::detail::base64_decode(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  bool bVar2;
  pointer pcVar3;
  runtime_error *prVar4;
  char cVar5;
  ulong uVar6;
  pointer pcVar7;
  pointer pcVar8;
  bool bVar9;
  
  if ((input->_M_string_length & 3) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid base64 length!");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar2 = false;
  pcVar7 = (input->_M_dataplus)._M_p;
  do {
    pcVar3 = (input->_M_dataplus)._M_p + input->_M_string_length;
    if (pcVar3 <= pcVar7) {
      return __return_storage_ptr__;
    }
    pcVar8 = pcVar7 + 4;
    bVar9 = false;
    uVar6 = 0;
    do {
      cVar1 = pcVar7[uVar6];
      cVar5 = (char)__return_storage_ptr__;
      if ((((0x19 < (byte)(cVar1 + 0xbfU)) && (0x19 < (byte)(cVar1 + 0x9fU))) &&
          (9 < (byte)(cVar1 - 0x30U))) && ((cVar1 != '+' && (cVar1 != '/')))) {
        if (cVar1 != '=') {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"Invalid character in base64!");
LAB_0012b968:
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (pcVar3 + (-uVar6 - (long)pcVar7) != (pointer)0x2) {
          if (pcVar3 + (-uVar6 - (long)pcVar7) != (pointer)0x1) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"Invalid padding in base64!");
            goto LAB_0012b968;
          }
          std::__cxx11::string::push_back(cVar5);
        }
        std::__cxx11::string::push_back(cVar5);
        pcVar8 = pcVar7 + uVar6;
        bVar2 = true;
        break;
      }
      bVar9 = 2 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
    if (!bVar9) {
      if (bVar2) {
        return __return_storage_ptr__;
      }
      pcVar7 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar7 == &__return_storage_ptr__->field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(pcVar7);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar5);
    pcVar7 = pcVar8;
  } while( true );
}

Assistant:

inline std::string base64_decode(const std::string& input) {
  if (input.length() % 4) {
    throw std::runtime_error("Invalid base64 length!");
  }

  std::size_t padding = 0;

  if (!input.empty()) {
    if (input[input.length() - 1] == kPadCharacter) padding++;
    if (input[input.length() - 2] == kPadCharacter) padding++;
  }

  std::string decoded;
  decoded.reserve(((input.length() / 4) * 3) - padding);

  std::uint32_t temp = 0;
  auto it = input.begin();

  while (it < input.end()) {
    for (std::size_t i = 0; i < 4; ++i) {
      temp <<= 6;
      if (*it >= 0x41 && *it <= 0x5A) {
        temp |= *it - 0x41;
      } else if (*it >= 0x61 && *it <= 0x7A) {
        temp |= *it - 0x47;
      } else if (*it >= 0x30 && *it <= 0x39) {
        temp |= *it + 0x04;
      } else if (*it == 0x2B) {
        temp |= 0x3E;
      } else if (*it == 0x2F) {
        temp |= 0x3F;
      } else if (*it == kPadCharacter) {
        switch (input.end() - it) {
          case 1:
            decoded.push_back((temp >> 16) & 0x000000FF);
            decoded.push_back((temp >> 8) & 0x000000FF);
            return decoded;
          case 2:
            decoded.push_back((temp >> 10) & 0x000000FF);
            return decoded;
          default:
            throw std::runtime_error("Invalid padding in base64!");
        }
      } else {
        throw std::runtime_error("Invalid character in base64!");
      }

      ++it;
    }

    decoded.push_back((temp >> 16) & 0x000000FF);
    decoded.push_back((temp >> 8) & 0x000000FF);
    decoded.push_back((temp) & 0x000000FF);
  }

  return decoded;
}